

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CIrrDeviceSDL.cpp
# Opt level: O0

void __thiscall irr::CIrrDeviceSDL::setResizable(CIrrDeviceSDL *this,bool resize)

{
  byte bVar1;
  byte in_SIL;
  long in_RDI;
  
  bVar1 = in_SIL & 1;
  if (bVar1 != (*(byte *)(in_RDI + 0x144) & 1)) {
    if (bVar1 == 0) {
      *(uint *)(in_RDI + 0x100) = *(uint *)(in_RDI + 0x100) & 0xffffffdf;
    }
    else {
      *(uint *)(in_RDI + 0x100) = *(uint *)(in_RDI + 0x100) | 0x20;
    }
    if (*(long *)(in_RDI + 0xf8) != 0) {
      SDL_SetWindowResizable(*(undefined8 *)(in_RDI + 0xf8),bVar1);
    }
    *(byte *)(in_RDI + 0x144) = bVar1;
  }
  return;
}

Assistant:

void CIrrDeviceSDL::setResizable(bool resize)
{
#ifdef _IRR_EMSCRIPTEN_PLATFORM_
	os::Printer::log("Resizable not available on the web.", ELL_WARNING);
	return;
#else  // !_IRR_EMSCRIPTEN_PLATFORM_
	if (resize != Resizable) {
		if (resize)
			SDL_Flags |= SDL_WINDOW_RESIZABLE;
		else
			SDL_Flags &= ~SDL_WINDOW_RESIZABLE;

		if (Window) {
			SDL_SetWindowResizable(Window, (SDL_bool)resize);
		}
		Resizable = resize;
	}
#endif // !_IRR_EMSCRIPTEN_PLATFORM_
}